

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DescriptorPoolManager.cpp
# Opt level: O2

void __thiscall
Diligent::DynamicDescriptorSetAllocator::~DynamicDescriptorSetAllocator
          (DynamicDescriptorSetAllocator *this)

{
  unsigned_long *in_R8;
  string msg;
  string local_30;
  
  if ((this->m_AllocatedPools).
      super__Vector_base<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>,_std::allocator<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->m_AllocatedPools).
      super__Vector_base<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>,_std::allocator<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    FormatString<char[75]>
              (&local_30,
               (char (*) [75])
               "All allocated pools must be returned to the parent descriptor pool manager");
    DebugAssertionFailed
              (local_30._M_dataplus._M_p,"~DynamicDescriptorSetAllocator",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DescriptorPoolManager.cpp"
               ,0x140);
    std::__cxx11::string::~string((string *)&local_30);
  }
  FormatString<std::__cxx11::string,char[30],unsigned_long>
            (&local_30,(Diligent *)&this->m_Name,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             " peak descriptor pool count: ",(char (*) [30])&this->m_PeakPoolCount,in_R8);
  if (DebugMessageCallback != (undefined *)0x0) {
    (*(code *)DebugMessageCallback)(0,local_30._M_dataplus._M_p,0,0,0);
  }
  std::__cxx11::string::~string((string *)&local_30);
  std::
  vector<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>,_std::allocator<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>_>_>
  ::~vector(&this->m_AllocatedPools);
  std::__cxx11::string::~string((string *)&this->m_Name);
  return;
}

Assistant:

DynamicDescriptorSetAllocator::~DynamicDescriptorSetAllocator()
{
    DEV_CHECK_ERR(m_AllocatedPools.empty(), "All allocated pools must be returned to the parent descriptor pool manager");
    LOG_INFO_MESSAGE(m_Name, " peak descriptor pool count: ", m_PeakPoolCount);
}